

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::AcesInputFile::readPixels(AcesInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  half *in_RDI;
  float a;
  float b;
  float c;
  V3f aces;
  int x;
  Rgba *base;
  int y;
  int maxY;
  int minY;
  Vec3<float> local_44;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  half *local_28;
  int local_1c;
  int local_10;
  int local_c [3];
  
  RgbaInputFile::readPixels
            ((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int)in_stack_ffffffffffffffcc,(int)in_stack_ffffffffffffffc8);
  if ((*(byte *)(*(long *)(in_RDI + 4) + 0x28) & 1) != 0) {
    piVar3 = std::min<int>(local_c,&local_10);
    local_1c = *piVar3;
    piVar3 = std::max<int>(local_c,&local_10);
    iVar1 = *piVar3;
    for (; local_1c <= iVar1; local_1c = local_1c + 1) {
      local_28 = (half *)(*(long *)(*(long *)(in_RDI + 4) + 8) +
                          *(long *)(*(long *)(in_RDI + 4) + 0x10) *
                          (long)*(int *)(*(long *)(in_RDI + 4) + 0x20) * 8 +
                         *(long *)(*(long *)(in_RDI + 4) + 0x18) * (long)local_1c * 8);
      for (iVar2 = *(int *)(*(long *)(in_RDI + 4) + 0x20);
          iVar2 <= *(int *)(*(long *)(in_RDI + 4) + 0x24); iVar2 = iVar2 + 1) {
        a = half::operator_cast_to_float(local_28);
        b = half::operator_cast_to_float(local_28 + 1);
        c = half::operator_cast_to_float(local_28 + 2);
        Imath_2_5::Vec3<float>::Vec3(&local_44,a,b,c);
        Imath_2_5::operator*(stack0x00000028,(Matrix44<float> *)aces._0_8_);
        Imath_2_5::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,0);
        half::operator=(in_RDI,a);
        Imath_2_5::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,1);
        half::operator=(in_RDI,a);
        Imath_2_5::Vec3<float>::operator[]((Vec3<float> *)&stack0xffffffffffffffc8,2);
        half::operator=(in_RDI,a);
        local_28 = local_28 + *(long *)(*(long *)(in_RDI + 4) + 0x10) * 4;
      }
    }
  }
  return;
}

Assistant:

void		
AcesInputFile::readPixels (int scanLine1, int scanLine2)
{
    //
    // Copy the pixels from the RgbaInputFile into the frame buffer.
    //

    _data->rgbaFile->readPixels (scanLine1, scanLine2);

    //
    // If the RGB space of the input file is not the same as the ACES
    // RGB space, then the pixels in the frame buffer must be transformed
    // into the ACES RGB space.
    //

    if (!_data->mustConvertColor)
	return;

    int minY = min (scanLine1, scanLine2);
    int maxY = max (scanLine1, scanLine2);

    for (int y = minY; y <= maxY; ++y)
    {
	Rgba *base = _data->fbBase +
		     _data->fbXStride * _data->minX +
		     _data->fbYStride * y;

	for (int x = _data->minX; x <= _data->maxX; ++x)
	{
	    V3f aces = V3f (base->r, base->g, base->b) * _data->fileToAces;

	    base->r = aces[0];
	    base->g = aces[1];
	    base->b = aces[2];

	    base += _data->fbXStride;
	}
    }
}